

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageCrop(Image *image,Rectangle crop)

{
  int iVar1;
  void *__ptr;
  int iVar2;
  void *pvVar3;
  void *__dest;
  char *text;
  int iVar4;
  void *__src;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar8 = crop.width;
  fVar7 = crop.height;
  fVar6 = crop.x;
  fVar11 = crop.y;
  if (((image->data == (void *)0x0) || (image->width == 0)) || (image->height == 0)) {
    return;
  }
  if (fVar6 < 0.0) {
    fVar8 = fVar6 + fVar8;
    fVar6 = 0.0;
  }
  if (fVar11 < 0.0) {
    fVar7 = fVar11 + fVar7;
    fVar11 = 0.0;
  }
  fVar9 = (float)image->width;
  if (fVar9 < fVar6 + fVar8) {
    fVar8 = fVar9 - fVar6;
  }
  fVar10 = (float)image->height;
  if (fVar10 < fVar7 + fVar11) {
    fVar7 = fVar10 - fVar11;
  }
  if ((fVar9 < fVar6) || (fVar10 < fVar11)) {
    text = "IMAGE: Failed to crop, rectangle out of bounds";
  }
  else {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (image->format < 0xb) {
      iVar2 = GetPixelDataSize(1,1,image->format);
      pvVar3 = malloc((long)((int)(fVar8 * fVar7) * iVar2));
      iVar4 = (int)fVar11;
      __ptr = image->data;
      if (iVar4 < (int)(fVar7 + fVar11)) {
        iVar1 = image->width;
        lVar5 = (long)(int)(fVar7 + fVar11) - (long)iVar4;
        __src = (void *)(((long)iVar4 * (long)iVar1 + (long)(int)fVar6) * (long)iVar2 + (long)__ptr)
        ;
        __dest = pvVar3;
        do {
          memcpy(__dest,__src,(long)(iVar2 * (int)fVar8));
          __src = (void *)((long)__src + (long)iVar2 * (long)iVar1);
          __dest = (void *)((long)__dest + (long)(iVar2 * (int)fVar8));
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      free(__ptr);
      image->data = pvVar3;
      image->width = (int)fVar8;
      image->height = (int)fVar7;
      return;
    }
    text = "Image manipulation not supported for compressed formats";
  }
  TraceLog(4,text);
  return;
}

Assistant:

void ImageCrop(Image *image, Rectangle crop)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    // Security checks to validate crop rectangle
    if (crop.x < 0) { crop.width += crop.x; crop.x = 0; }
    if (crop.y < 0) { crop.height += crop.y; crop.y = 0; }
    if ((crop.x + crop.width) > image->width) crop.width = image->width - crop.x;
    if ((crop.y + crop.height) > image->height) crop.height = image->height - crop.y;
    if ((crop.x > image->width) || (crop.y > image->height))
    {
        TRACELOG(LOG_WARNING, "IMAGE: Failed to crop, rectangle out of bounds");
        return;
    }

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);

        unsigned char *croppedData = (unsigned char *)RL_MALLOC((int)(crop.width*crop.height)*bytesPerPixel);

        // OPTION 1: Move cropped data line-by-line
        for (int y = (int)crop.y, offsetSize = 0; y < (int)(crop.y + crop.height); y++)
        {
            memcpy(croppedData + offsetSize, ((unsigned char *)image->data) + (y*image->width + (int)crop.x)*bytesPerPixel, (int)crop.width*bytesPerPixel);
            offsetSize += ((int)crop.width*bytesPerPixel);
        }

        /*
        // OPTION 2: Move cropped data pixel-by-pixel or byte-by-byte
        for (int y = (int)crop.y; y < (int)(crop.y + crop.height); y++)
        {
            for (int x = (int)crop.x; x < (int)(crop.x + crop.width); x++)
            {
                //memcpy(croppedData + ((y - (int)crop.y)*(int)crop.width + (x - (int)crop.x))*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + x)*bytesPerPixel, bytesPerPixel);
                for (int i = 0; i < bytesPerPixel; i++) croppedData[((y - (int)crop.y)*(int)crop.width + (x - (int)crop.x))*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + x)*bytesPerPixel + i];
            }
        }
        */

        RL_FREE(image->data);
        image->data = croppedData;
        image->width = (int)crop.width;
        image->height = (int)crop.height;
    }
}